

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Vec_Flt_t * Scl_LibertyReadFloatVec(char *pName)

{
  Vec_Flt_t *p;
  double dVar1;
  Vec_Flt_t *vValues;
  char *pToken;
  char *pName_local;
  
  p = Vec_FltAlloc(100);
  vValues = (Vec_Flt_t *)strtok(pName," \t\n\r\\\",");
  while (vValues != (Vec_Flt_t *)0x0) {
    dVar1 = atof((char *)vValues);
    Vec_FltPush(p,(float)dVar1);
    vValues = (Vec_Flt_t *)strtok((char *)0x0," \t\n\r\\\",");
  }
  return p;
}

Assistant:

Vec_Flt_t * Scl_LibertyReadFloatVec( char * pName )
{
    char * pToken;
    Vec_Flt_t * vValues = Vec_FltAlloc( 100 );
    for ( pToken = strtok(pName, " \t\n\r\\\","); pToken; pToken = strtok(NULL, " \t\n\r\\\",") )
        Vec_FltPush( vValues, atof(pToken) );
    return vValues;
}